

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9TokenizeInput(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)

{
  byte *pbVar1;
  void *pvVar2;
  SySet *pSVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  sxi32 sVar7;
  char *zBase;
  ushort **ppuVar8;
  ulong uVar9;
  byte *pbVar10;
  byte *pbVar11;
  jx9_expr_op *pjVar12;
  byte *pbVar13;
  long lVar14;
  uint uVar15;
  byte bVar16;
  byte *pbVar17;
  byte *pbVar18;
  SyToken *pLast;
  char *zSrc;
  int iVar19;
  int iVar20;
  sxu32 sVar21;
  uint uVar22;
  bool bVar23;
  
  pbVar10 = pStream->zText;
  pbVar1 = pStream->zEnd;
  if (pbVar1 <= pbVar10) {
    return -0x12;
  }
  pbVar17 = pbVar10 + -1;
  uVar15 = (uint)pbVar10;
  iVar20 = -uVar15;
  lVar14 = 0;
  while( true ) {
    bVar16 = pbVar10[lVar14];
    if ((0xbf < (ulong)bVar16) ||
       (ppuVar8 = __ctype_b_loc(), (*(byte *)((long)*ppuVar8 + (ulong)bVar16 * 2 + 1) & 0x20) == 0))
    break;
    if (bVar16 == 10) {
      pStream->nLine = pStream->nLine + 1;
    }
    lVar5 = lVar14 + 1;
    pStream->zText = pbVar10 + lVar5;
    lVar14 = lVar14 + 1;
    pbVar17 = pbVar17 + 1;
    iVar20 = iVar20 + 0x7fffffff;
    if (pbVar10 + lVar5 == pbVar1) {
      return -0x12;
    }
  }
  sVar21 = pStream->nLine;
  pToken->nLine = sVar21;
  pToken->pUserData = (void *)0x0;
  pbVar11 = pbVar10 + lVar14;
  (pToken->sData).zString = (char *)pbVar11;
  (pToken->sData).nByte = 0;
  bVar16 = pbVar10[lVar14];
  uVar9 = (ulong)bVar16;
  iVar19 = (int)lVar14;
  pbVar18 = pbVar11;
  if (0xbf < uVar9) goto LAB_00124743;
  ppuVar8 = __ctype_b_loc();
  if ((uVar9 == 0x5f) || (((*ppuVar8)[uVar9] & 0x400) != 0)) {
    pbVar10 = pbVar10 + lVar14 + 1;
    do {
      pbVar18 = pbVar10;
      pStream->zText = pbVar18;
LAB_00124743:
      pbVar13 = pbVar18;
      if (0xbf < *pbVar18) {
        pbVar13 = pbVar18 + 1;
      }
      pbVar10 = pbVar13;
      if (pbVar13 < pbVar1) {
        lVar14 = (long)pbVar1 - (long)pbVar13;
        do {
          uVar9 = (ulong)*pbVar13;
          pbVar10 = pbVar13;
          if ((0xbf < uVar9) ||
             ((ppuVar8 = __ctype_b_loc(), uVar9 != 0x5f && (((*ppuVar8)[uVar9] & 8) == 0)))) break;
          pbVar13 = pbVar13 + 1;
          lVar14 = lVar14 + -1;
          pbVar10 = pbVar1;
        } while (lVar14 != 0);
      }
      if (pbVar10 == pbVar18) {
        iVar4 = (int)pbVar18;
        uVar22 = (iVar4 - uVar15) - iVar19;
        (pToken->sData).nByte = uVar22;
        if ((1 < (int)uVar22) &&
           (uVar6 = (int)(uVar22 ^ (int)(char)*pbVar11 << 2 ^
                         (char)pbVar17[iVar20 + iVar4 & 0x7fffffff] * 3) % 0x3b,
           (0x7d9b967832231afU >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
          pbVar10 = keywordCode_aHash + (int)uVar6;
          do {
            uVar9 = (ulong)(*pbVar10 - 1);
            if (((iVar4 - (uint)(byte)keywordCode_aLen[uVar9]) - uVar15 == iVar19) &&
               (sVar7 = SyMemcmp("printegereturnconstaticaselseifloatincludefaultDIEXITcontinuediewhileASPRINTbooleanbreakforeachfunctionimportstringswitchuplink"
                                 + *(ushort *)(keywordCode_aOffset + uVar9 * 2),pbVar11,uVar22),
               sVar7 == 0)) {
              uVar15 = *(uint *)(keywordCode_aCode + uVar9 * 4);
              pToken->nType = 4;
              pToken->pUserData = (void *)(ulong)uVar15;
              return 0;
            }
            pbVar10 = keywordCode_aNext + uVar9;
          } while ((0x7cbffdffUL >> (uVar9 & 0x3f) & 1) == 0);
        }
        pToken->nType = 8;
        return 0;
      }
    } while( true );
  }
  if (uVar9 == 0x23) {
LAB_00123ed0:
    pbVar10 = pbVar10 + lVar14;
    do {
      pbVar10 = pbVar10 + 1;
      pStream->zText = pbVar10;
      if (pbVar1 <= pbVar10) {
        return -0x19;
      }
    } while (*pbVar10 != 10);
    return -0x19;
  }
  if ((bVar16 == 0x2f) && (pbVar17 = pbVar10 + lVar14 + 1, pbVar17 < pbVar1)) {
    if (*pbVar17 == 0x2f) goto LAB_00123ed0;
    if (*pbVar17 == 0x2a) {
      pbVar11 = pbVar10 + lVar14 + 2;
      pStream->zText = pbVar11;
      pbVar17 = pbVar11;
      if (pbVar11 < pbVar1) {
        pbVar10 = pbVar10 + lVar14 + 3;
        do {
          if (pbVar10[-1] == 10) {
            sVar21 = sVar21 + 1;
            pStream->nLine = sVar21;
          }
          else if (pbVar10[-1] == 0x2a) {
            pbVar17 = pbVar11;
            if (pbVar1 <= pbVar10) break;
            if (*pbVar10 == 0x2f) {
              pbVar17 = pbVar10 + -1;
              break;
            }
          }
          pbVar11 = pbVar11 + 1;
          pStream->zText = pbVar10;
          bVar23 = pbVar10 < pbVar1;
          pbVar17 = pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar23);
      }
      pStream->zText = pbVar17 + 2;
      return -0x19;
    }
  }
  if (((*ppuVar8)[uVar9] >> 0xb & 1) != 0) {
    pbVar10 = pbVar10 + lVar14 + 2;
    do {
      pbVar11 = pbVar10;
      pbVar17 = pbVar11 + -1;
      pStream->zText = pbVar17;
      if (pbVar1 <= pbVar17) {
        pToken->nType = 1;
        goto LAB_001240dd;
      }
    } while (((ulong)*pbVar17 < 0xc0) &&
            (pbVar10 = pbVar11 + 1, (*(byte *)((long)*ppuVar8 + (ulong)*pbVar17 * 2 + 1) & 8) != 0))
    ;
    pToken->nType = 1;
    if (pbVar11[-1] == 0x2e) {
      pbVar10 = pbVar11 + 2;
      do {
        pbVar11 = pbVar10;
        pbVar17 = pbVar11 + -2;
        pStream->zText = pbVar17;
        if (pbVar1 <= pbVar17) goto LAB_001240cb;
        bVar16 = *pbVar17;
      } while (((ulong)bVar16 < 0xc0) &&
              (pbVar10 = pbVar11 + 1, (*(byte *)((long)*ppuVar8 + (ulong)bVar16 * 2 + 1) & 8) != 0))
      ;
      if ((bVar16 & 0xdf) == 0x45) {
        pbVar17 = pbVar11 + -1;
        pStream->zText = pbVar17;
        if (pbVar17 < pbVar1) {
          pbVar10 = pbVar17;
          if ((((*pbVar17 == 0x2b) || (*pbVar17 == 0x2d)) && (pbVar11 < pbVar1)) &&
             (((ulong)*pbVar11 < 0xc0 &&
              ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar11 * 2 + 1) & 8) != 0)))) {
            pStream->zText = pbVar11;
            pbVar10 = pbVar11;
          }
          pbVar17 = pbVar10;
          if (pbVar10 < pbVar1) {
            lVar14 = (long)pbVar1 - (long)pbVar10;
            do {
              pbVar17 = pbVar10;
              if ((0xbf < (ulong)*pbVar10) ||
                 ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar10 * 2 + 1) & 8) == 0)) break;
              pbVar10 = pbVar10 + 1;
              pStream->zText = pbVar10;
              lVar14 = lVar14 + -1;
              pbVar17 = pbVar1;
            } while (lVar14 != 0);
          }
        }
      }
LAB_001240cb:
      pToken->nType = 2;
    }
    else {
      bVar16 = pbVar11[-1] & 0xdf;
      if (bVar16 == 0x42) {
        do {
          pbVar17 = pbVar11;
          pStream->zText = pbVar17;
          if (pbVar1 <= pbVar17) break;
          pbVar11 = pbVar17 + 1;
        } while ((*pbVar17 & 0xfe) == 0x30);
      }
      else if (bVar16 == 0x45) {
        pStream->zText = pbVar11;
        pbVar17 = pbVar11;
        if (pbVar11 < pbVar1) {
          if ((((*pbVar11 == 0x2b) || (*pbVar11 == 0x2d)) &&
              (pbVar10 = pbVar11 + 1, pbVar10 < pbVar1)) &&
             (((ulong)*pbVar10 < 0xc0 &&
              ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar10 * 2 + 1) & 8) != 0)))) {
            pStream->zText = pbVar10;
            pbVar11 = pbVar10;
          }
          pbVar17 = pbVar11;
          if (pbVar11 < pbVar1) {
            lVar14 = (long)pbVar1 - (long)pbVar11;
            do {
              pbVar17 = pbVar11;
              if ((0xbf < (ulong)*pbVar11) ||
                 ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar11 * 2 + 1) & 8) == 0)) break;
              pbVar11 = pbVar11 + 1;
              pStream->zText = pbVar11;
              lVar14 = lVar14 + -1;
              pbVar17 = pbVar1;
            } while (lVar14 != 0);
          }
        }
        pToken->nType = 2;
      }
      else if (bVar16 == 0x58) {
        do {
          pbVar17 = pbVar11;
          pStream->zText = pbVar17;
          if ((pbVar1 <= pbVar17) || (0xbf < (ulong)*pbVar17)) break;
          pbVar11 = pbVar17 + 1;
        } while ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar17 * 2 + 1) & 0x10) != 0);
      }
    }
LAB_001240dd:
    (pToken->sData).nByte = ((int)pbVar17 - uVar15) - iVar19;
    return 0;
  }
  pbVar17 = pbVar10 + lVar14 + 1;
  pStream->zText = pbVar17;
  pToken->nType = 0x20;
  if (0x5a < bVar16) {
    if (bVar16 < 0x7b) {
      if (bVar16 == 0x5b) {
        pToken->nType = 0x820;
      }
      else if (bVar16 == 0x5d) {
        pToken->nType = 0x1000;
      }
      else if (bVar16 == 0x5e) goto switchD_00123fb8_caseD_25;
    }
    else if (bVar16 == 0x7b) {
      pToken->nType = 0x40;
    }
    else if (bVar16 == 0x7c) {
      if ((pbVar17 < pbVar1) && ((*pbVar17 == 0x3d || (*pbVar17 == 0x7c)))) goto LAB_00124175;
    }
    else if (bVar16 == 0x7d) {
      pToken->nType = 0x80;
    }
    goto switchD_00123fb8_caseD_23;
  }
  switch(bVar16) {
  case 0x21:
    if ((pbVar17 < pbVar1) && (*pbVar17 == 0x3d)) {
LAB_00124267:
      pbVar17 = pbVar10 + lVar14 + 2;
      pStream->zText = pbVar17;
      if ((pbVar17 < pbVar1) && (*pbVar17 == 0x3d)) {
        pbVar10 = pbVar10 + lVar14 + 3;
        goto LAB_001242fd;
      }
    }
    break;
  case 0x22:
    (pToken->sData).zString = (char *)pbVar17;
    do {
      if (pbVar1 <= pbVar17) {
LAB_0012465d:
        (pToken->sData).nByte = (~uVar15 + (int)pbVar17) - iVar19;
        pToken->nType = 0x2000;
        pStream->zText = pbVar17 + 1;
        return 0;
      }
      bVar16 = *pbVar17;
      if (bVar16 == 0x7b) {
        pbVar10 = pbVar17 + 1;
        if ((pbVar10 < pbVar1) && (*pbVar10 == 0x24)) {
          pStream->zText = pbVar10;
          pbVar11 = pbVar1 + (-1 - (long)pbVar17);
          iVar20 = 1;
          do {
            pbVar17 = pbVar10;
            bVar16 = *pbVar17;
            if (bVar16 == 10) {
              sVar21 = sVar21 + 1;
              pStream->nLine = sVar21;
            }
            else if (bVar16 == 0x7d) {
              if (iVar20 < 2) {
                pStream->zText = pbVar17 + 1;
                break;
              }
              iVar20 = iVar20 + -1;
            }
            else if (bVar16 == 0x7b) {
              iVar20 = iVar20 + 1;
            }
            pStream->zText = pbVar17 + 1;
            pbVar11 = pbVar11 + -1;
            pbVar10 = pbVar17 + 1;
          } while (pbVar11 != (byte *)0x0);
          pbVar17 = pbVar17 + 1;
          if (pbVar17 < pbVar1) {
            bVar16 = *pbVar17;
            goto LAB_0012444c;
          }
          goto LAB_0012465d;
        }
      }
      else {
LAB_0012444c:
        if (bVar16 == 10) {
          sVar21 = sVar21 + 1;
          pStream->nLine = sVar21;
        }
        else if (bVar16 == 0x22) {
          if (pbVar17[-1] != 0x5c) goto LAB_0012465d;
          pbVar10 = pbVar17 + -2;
          pbVar11 = pStream->zInput;
          if (pbVar11 < pbVar10) {
            uVar22 = 1;
            do {
              uVar6 = uVar22;
              if (*pbVar10 != 0x5c) break;
              pbVar10 = pbVar10 + -1;
              uVar22 = uVar22 + 1;
              uVar6 = ~(uint)pbVar11 + (int)pbVar17;
            } while (pbVar11 < pbVar10);
            if ((uVar6 & 1) == 0) goto LAB_0012465d;
          }
        }
      }
      pbVar17 = pbVar17 + 1;
      pStream->zText = pbVar17;
    } while( true );
  case 0x24:
    pToken->nType = 0x10;
    break;
  case 0x25:
  case 0x2a:
  case 0x2f:
switchD_00123fb8_caseD_25:
    if ((pbVar1 <= pbVar17) || (*pbVar17 != 0x3d)) break;
LAB_00124175:
    pbVar10 = pbVar10 + lVar14 + 2;
    goto LAB_001242fd;
  case 0x26:
    pToken->nType = 0x200020;
    if ((pbVar17 < pbVar1) && ((*pbVar17 == 0x26 || (*pbVar17 == 0x3d)))) {
      pToken->nType = 0x20;
      pbVar17 = pbVar10 + lVar14 + 2;
      pStream->zText = pbVar17;
    }
  case 0x2e:
    if ((pbVar17 < pbVar1) && ((*pbVar17 == 0x3d || (*pbVar17 == 0x2e)))) {
      pbVar10 = pbVar17 + 1;
LAB_001242fd:
      pStream->zText = pbVar10;
    }
    break;
  case 0x27:
    (pToken->sData).zString = (char *)pbVar17;
    pbVar11 = pbVar17;
    if (pbVar17 < pbVar1) {
      pbVar10 = pbVar17 + (long)(pbVar1 + (~(ulong)pbVar10 - lVar14));
      do {
        if (*pbVar17 == 10) {
          sVar21 = sVar21 + 1;
          pStream->nLine = sVar21;
        }
        else if (*pbVar17 == 0x27) {
          pbVar11 = pbVar17;
          if (pbVar17[-1] != 0x5c) break;
          pbVar18 = pbVar17 + -2;
          if (pStream->zInput < pbVar18) {
            bVar23 = true;
            do {
              if (*pbVar18 != 0x5c) break;
              pbVar18 = pbVar18 + -1;
              bVar23 = (bool)(bVar23 ^ 1);
            } while (pStream->zInput < pbVar18);
            if (!bVar23) break;
          }
        }
        pbVar17 = pbVar17 + 1;
        pStream->zText = pbVar17;
        pbVar11 = pbVar10;
      } while (pbVar17 != pbVar1);
    }
    (pToken->sData).nByte = (~uVar15 + (int)pbVar11) - iVar19;
    pToken->nType = 0x4000;
    pStream->zText = pbVar11 + 1;
    return 0;
  case 0x28:
    pToken->nType = 0x200;
    break;
  case 0x29:
    pSVar3 = pStream->pSet;
    uVar15 = pSVar3->nUsed;
    if (1 < uVar15) {
      pvVar2 = pSVar3->pBase;
      uVar9 = (ulong)((uVar15 - 1) * pSVar3->eSize);
      if ((((*(byte *)((long)pvVar2 + uVar9 + 0x10) & 4) != 0) &&
          (uVar22 = *(uint *)((long)pvVar2 + uVar9 + 0x18), (uVar22 & 0x78000) != 0)) &&
         ((*(byte *)((long)pvVar2 + (ulong)(pSVar3->eSize * (uVar15 - 2)) + 0x11) & 2) != 0)) {
        if ((uVar22 >> 0x11 & 1) == 0) {
          if ((short)uVar22 < 0) {
            zSrc = "(bool)";
          }
          else {
            zSrc = "(string)";
            if ((uVar22 >> 0x12 & 1) == 0) {
              zSrc = "(int)";
            }
          }
        }
        else {
          zSrc = "(float)";
        }
        (pToken->sData).zString = zSrc;
        sVar21 = SyStrlen(zSrc);
        (pToken->sData).nByte = sVar21;
        pjVar12 = jx9ExprExtractOperator(&pToken->sData,(SyToken *)0x0);
        pToken->pUserData = pjVar12;
        pSVar3->nUsed = uVar15 - 2;
        return 0;
      }
    }
    pToken->nType = 0x400;
    break;
  case 0x2b:
    if ((pbVar17 < pbVar1) && ((*pbVar17 == 0x3d || (*pbVar17 == 0x2b)))) goto LAB_00124175;
    break;
  case 0x2c:
    pToken->nType = 0x20020;
    break;
  case 0x2d:
    if ((pbVar17 < pbVar1) &&
       (((bVar16 = *pbVar17, bVar16 == 0x3e || (bVar16 == 0x3d)) || (bVar16 == 0x2d))))
    goto LAB_00124175;
    break;
  case 0x3a:
    pToken->nType = 0x100000;
    break;
  case 0x3b:
    pToken->nType = 0x40000;
    break;
  case 0x3c:
    if (pbVar17 < pbVar1) {
      bVar16 = *pbVar17;
      if ((bVar16 == 0x3e) || (bVar16 == 0x3d)) goto LAB_00124175;
      if (bVar16 == 0x3c) {
        pbVar17 = pbVar10 + lVar14 + 2;
        pStream->zText = pbVar17;
        if (pbVar17 < pbVar1) {
          if (*pbVar17 == 0x3c) {
            pStream->zText = pbVar10 + lVar14 + 3;
            sVar7 = LexExtractNowdoc(pStream,pToken);
            if (sVar7 == 0) {
              return 0;
            }
            if ((pToken->sData).nByte != 0) goto LAB_0012460a;
          }
          else if (*pbVar17 == 0x3d) {
            pbVar10 = pbVar10 + lVar14 + 3;
            goto LAB_001242fd;
          }
        }
      }
    }
    break;
  case 0x3d:
    pToken->nType = 0x400020;
    if ((pbVar17 < pbVar1) && (*pbVar17 == 0x3d)) {
      pToken->nType = 0x20;
      goto LAB_00124267;
    }
    break;
  case 0x3e:
    if (pbVar17 < pbVar1) {
      if (*pbVar17 == 0x3d) goto LAB_00124175;
      if (*pbVar17 == 0x3e) goto LAB_00124267;
    }
  }
switchD_00123fb8_caseD_23:
  (pToken->sData).nByte = *(int *)&pStream->zText - *(int *)&(pToken->sData).zString;
LAB_0012460a:
  uVar15 = pToken->nType;
  if ((uVar15 & 0x20) != 0) {
    pSVar3 = pStream->pSet;
    if (pSVar3->nUsed == 0) {
      pLast = (SyToken *)0x0;
    }
    else {
      pLast = (SyToken *)((ulong)((pSVar3->nUsed - 1) * pSVar3->eSize) + (long)pSVar3->pBase);
    }
    pjVar12 = jx9ExprExtractOperator(&pToken->sData,pLast);
    if (pjVar12 == (jx9_expr_op *)0x0) {
      uVar15 = uVar15 & 0xffffffdf;
      uVar22 = 0x1000000;
      if (uVar15 != 0) {
        uVar22 = uVar15;
      }
      pToken->nType = uVar22;
    }
    else {
      pToken->pUserData = pjVar12;
    }
  }
  return 0;
}

Assistant:

static sxi32 jx9TokenizeInput(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)
{
	SyString *pStr;
	sxi32 rc;
	/* Ignore leading white spaces */
	while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisSpace(pStream->zText[0]) ){
		/* Advance the stream cursor */
		if( pStream->zText[0] == '\n' ){
			/* Update line counter */
			pStream->nLine++;
		}
		pStream->zText++;
	}
	if( pStream->zText >= pStream->zEnd ){
		/* End of input reached */
		return SXERR_EOF;
	}
	/* Record token starting position and line */
	pToken->nLine = pStream->nLine;
	pToken->pUserData = 0;
	pStr = &pToken->sData;
	SyStringInitFromBuf(pStr, pStream->zText, 0);
	if( pStream->zText[0] >= 0xc0 || SyisAlpha(pStream->zText[0]) || pStream->zText[0] == '_' ){
		/* The following code fragment is taken verbatim from the xPP source tree.
		 * xPP is a modern embeddable macro processor with advanced features useful for
		 * application seeking for a production quality, ready to use macro processor.
		 * xPP is a widely used library developed and maintened by Symisc Systems.
		 * You can reach the xPP home page by following this link:
		 * http://xpp.symisc.net/
		 */
		const unsigned char *zIn;
		sxu32 nKeyword;
		/* Isolate UTF-8 or alphanumeric stream */
		if( pStream->zText[0] < 0xc0 ){
			pStream->zText++;
		}
		for(;;){
			zIn = pStream->zText;
			if( zIn[0] >= 0xc0 ){
				zIn++;
				/* UTF-8 stream */
				while( zIn < pStream->zEnd && ((zIn[0] & 0xc0) == 0x80) ){
					zIn++;
				}
			}
			/* Skip alphanumeric stream */
			while( zIn < pStream->zEnd && zIn[0] < 0xc0 && (SyisAlphaNum(zIn[0]) || zIn[0] == '_') ){
				zIn++;
			}
			if( zIn == pStream->zText ){
				/* Not an UTF-8 or alphanumeric stream */
				break;
			}
			/* Synchronize pointers */
			pStream->zText = zIn;
		}
		/* Record token length */
		pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		nKeyword = keywordCode(pStr->zString, (int)pStr->nByte);
		if( nKeyword != JX9_TK_ID ){
			/* We are dealing with a keyword [i.e: if, function, CREATE, ...], save the keyword ID */
			pToken->nType = JX9_TK_KEYWORD;
			pToken->pUserData = SX_INT_TO_PTR(nKeyword);
		}else{
			/* A simple identifier */
			pToken->nType = JX9_TK_ID;
		}
	}else{
		sxi32 c;
		/* Non-alpha stream */
		if( pStream->zText[0] == '#' || 
			( pStream->zText[0] == '/' &&  &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '/') ){
				pStream->zText++;
				/* Inline comments */
				while( pStream->zText < pStream->zEnd && pStream->zText[0] != '\n' ){
					pStream->zText++;
				}
				/* Tell the upper-layer to ignore this token */ 
				return SXERR_CONTINUE;
		}else if( pStream->zText[0] == '/' && &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '*' ){
			pStream->zText += 2;
			/* Block comment */
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '*' ){
					if( &pStream->zText[1] >= pStream->zEnd || pStream->zText[1] == '/'  ){
						break;
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			pStream->zText += 2;
			/* Tell the upper-layer to ignore this token */
			return SXERR_CONTINUE;
		}else if( SyisDigit(pStream->zText[0]) ){
			pStream->zText++;
			/* Decimal digit stream */
			while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
				pStream->zText++;
			}
			/* Mark the token as integer until we encounter a real number */
			pToken->nType = JX9_TK_INTEGER;
			if( pStream->zText < pStream->zEnd ){
				c = pStream->zText[0];
				if( c == '.' ){
					/* Real number */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
						pStream->zText++;
					}
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c=='e' || c=='E' ){
							pStream->zText++;
							if( pStream->zText < pStream->zEnd ){
								c = pStream->zText[0];
								if( (c =='+' || c=='-') && &pStream->zText[1] < pStream->zEnd  &&
									pStream->zText[1] < 0xc0 && SyisDigit(pStream->zText[1]) ){
										pStream->zText++;
								}
								while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
									pStream->zText++;
								}
							}
						}
					}
					pToken->nType = JX9_TK_REAL;
				}else if( c=='e' || c=='E' ){
					SXUNUSED(pUserData); /* Prevent compiler warning */
					SXUNUSED(pCtxData);
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( (c =='+' || c=='-') && &pStream->zText[1] < pStream->zEnd  &&
							pStream->zText[1] < 0xc0 && SyisDigit(pStream->zText[1]) ){
								pStream->zText++;
						}
						while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
							pStream->zText++;
						}
					}
					pToken->nType = JX9_TK_REAL;
				}else if( c == 'x' || c == 'X' ){
					/* Hex digit stream */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisHex(pStream->zText[0]) ){
						pStream->zText++;
					}
				}else if(c  == 'b' || c == 'B' ){
					/* Binary digit stream */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && (pStream->zText[0] == '0' || pStream->zText[0] == '1') ){
						pStream->zText++;
					}
				}
			}
			/* Record token length */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			return SXRET_OK;
		}
		c = pStream->zText[0];
		pStream->zText++; /* Advance the stream cursor */
		/* Assume we are dealing with an operator*/
		pToken->nType = JX9_TK_OP;
		switch(c){
		case '$': pToken->nType = JX9_TK_DOLLAR; break;
		case '{': pToken->nType = JX9_TK_OCB;   break; 
		case '}': pToken->nType = JX9_TK_CCB;    break;
		case '(': pToken->nType = JX9_TK_LPAREN; break; 
		case '[': pToken->nType |= JX9_TK_OSB;   break; /* Bitwise operation here, since the square bracket token '[' 
														 * is a potential operator [i.e: subscripting] */
		case ']': pToken->nType = JX9_TK_CSB;    break;
		case ')': {
			SySet *pTokSet = pStream->pSet;
			/* Assemble type cast operators [i.e: (int), (float), (bool)...] */ 
			if( pTokSet->nUsed >= 2 ){
				SyToken *pTmp;
				/* Peek the last recongnized token */
				pTmp = (SyToken *)SySetPeek(pTokSet);
				if( pTmp->nType & JX9_TK_KEYWORD ){
					sxi32 nID = SX_PTR_TO_INT(pTmp->pUserData);
					if( (sxu32)nID & (JX9_TKWRD_INT|JX9_TKWRD_FLOAT|JX9_TKWRD_STRING|JX9_TKWRD_BOOL) ){
						pTmp = (SyToken *)SySetAt(pTokSet, pTokSet->nUsed - 2);
						if( pTmp->nType & JX9_TK_LPAREN ){
							/* Merge the three tokens '(' 'TYPE' ')' into a single one */
							const char * zTypeCast = "(int)";
							if( nID & JX9_TKWRD_FLOAT ){
								zTypeCast = "(float)";
							}else if( nID & JX9_TKWRD_BOOL ){
								zTypeCast = "(bool)";
							}else if( nID & JX9_TKWRD_STRING ){
								zTypeCast = "(string)";
							}
							/* Reflect the change */
							pToken->nType = JX9_TK_OP;
							SyStringInitFromBuf(&pToken->sData, zTypeCast, SyStrlen(zTypeCast));
							/* Save the instance associated with the type cast operator */
							pToken->pUserData = (void *)jx9ExprExtractOperator(&pToken->sData, 0);
							/* Remove the two previous tokens */
							pTokSet->nUsed -= 2;
							return SXRET_OK;
						}
					}
				}
			}
			pToken->nType = JX9_TK_RPAREN;
			break;
				  }
		case '\'':{
			/* Single quoted string */
			pStr->zString++;
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '\''  ){
					if( pStream->zText[-1] != '\\' ){
						break;
					}else{
						const unsigned char *zPtr = &pStream->zText[-2];
						sxi32 i = 1;
						while( zPtr > pStream->zInput && zPtr[0] == '\\' ){
							zPtr--;
							i++;
						}
						if((i&1)==0){
							break;
						}
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			/* Record token length and type */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			pToken->nType = JX9_TK_SSTR;
			/* Jump the trailing single quote */
			pStream->zText++;
			return SXRET_OK;
				  }
		case '"':{
			sxi32 iNest;
			/* Double quoted string */
			pStr->zString++;
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '{' && &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '$'){
					iNest = 1;
					pStream->zText++;
					/* TICKET 1433-40: Hnadle braces'{}' in double quoted string where everything is allowed */
					while(pStream->zText < pStream->zEnd ){
						if( pStream->zText[0] == '{' ){
							iNest++;
						}else if (pStream->zText[0] == '}' ){
							iNest--;
							if( iNest <= 0 ){
								pStream->zText++;
								break;
							}
						}else if( pStream->zText[0] == '\n' ){
							pStream->nLine++;
						}
						pStream->zText++;
					}
					if( pStream->zText >= pStream->zEnd ){
						break;
					}
				}
				if( pStream->zText[0] == '"' ){
					if( pStream->zText[-1] != '\\' ){
						break;
					}else{
						const unsigned char *zPtr = &pStream->zText[-2];
						sxi32 i = 1;
						while( zPtr > pStream->zInput && zPtr[0] == '\\' ){
							zPtr--;
							i++;
						}
						if((i&1)==0){
							break;
						}
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			/* Record token length and type */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			pToken->nType = JX9_TK_DSTR;
			/* Jump the trailing quote */
			pStream->zText++;
			return SXRET_OK;
				  }
		case ':':
			pToken->nType = JX9_TK_COLON; /* Single colon */
			break;
		case ',': pToken->nType |= JX9_TK_COMMA;  break; /* Comma is also an operator */
		case ';': pToken->nType = JX9_TK_SEMI;   break;
			/* Handle combined operators [i.e: +=, ===, !=== ...] */
		case '=':
			pToken->nType |= JX9_TK_EQUAL;
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '=' ){
					pToken->nType &= ~JX9_TK_EQUAL;
					/* Current operator: == */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
						/* Current operator: === */
						pStream->zText++;
					}
				}
			}
			break;
		case '!':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: != */
				pStream->zText++;
				if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
					/* Current operator: !== */
					pStream->zText++;
				}
			}
			break;
		case '&':
			pToken->nType |= JX9_TK_AMPER;
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '&' ){
					pToken->nType &= ~JX9_TK_AMPER;
					/* Current operator: && */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					pToken->nType &= ~JX9_TK_AMPER;
					/* Current operator: &= */
					pStream->zText++;
				}
			}
		case '.':
			if( pStream->zText < pStream->zEnd && (pStream->zText[0] == '.' || pStream->zText[0] == '=') ){
				/* Concatenation operator: '..' or '.='  */
				pStream->zText++;
			}
			break;
		case '|':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '|' ){
					/* Current operator: || */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: |= */
					pStream->zText++;
				}
			}
			break;
		case '+':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '+' ){
					/* Current operator: ++ */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: += */
					pStream->zText++;
				}
			}
			break;
		case '-':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '-' ){
					/* Current operator: -- */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: -= */
					pStream->zText++;
				}else if( pStream->zText[0] == '>' ){
					/* Current operator: -> */
					pStream->zText++;
				}
			}
			break;
		case '*':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: *= */
				pStream->zText++;
			}
			break;
		case '/':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: /= */
				pStream->zText++;
			}
			break;
		case '%':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: %= */
				pStream->zText++;
			}
			break;
		case '^':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: ^= */
				pStream->zText++;
			}
			break;
		case '<':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '<' ){
					/* Current operator: << */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						if( pStream->zText[0] == '=' ){
							/* Current operator: <<= */
							pStream->zText++;
						}else if( pStream->zText[0] == '<' ){
							/* Current Token: <<<  */
							pStream->zText++;
							/* This may be the beginning of a Heredoc/Nowdoc string, try to delimit it */
							rc = LexExtractNowdoc(&(*pStream), &(*pToken));
							if( rc == SXRET_OK ){
								/* Here/Now doc successfuly extracted */
								return SXRET_OK;
							}
						}
					}
				}else if( pStream->zText[0] == '>' ){
					/* Current operator: <> */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: <= */
					pStream->zText++;
				}
			}
			break;
		case '>':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '>' ){
					/* Current operator: >> */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
						/* Current operator: >>= */
						pStream->zText++;
					}
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: >= */
					pStream->zText++;
				}
			}
			break;
		default:
			break;
		}
		if( pStr->nByte <= 0 ){
			/* Record token length */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		}
		if( pToken->nType & JX9_TK_OP ){
			const jx9_expr_op *pOp;
			/* Check if the extracted token is an operator */
			pOp = jx9ExprExtractOperator(pStr, (SyToken *)SySetPeek(pStream->pSet));
			if( pOp == 0 ){
				/* Not an operator */
				pToken->nType &= ~JX9_TK_OP;
				if( pToken->nType <= 0 ){
					pToken->nType = JX9_TK_OTHER;
				}
			}else{
				/* Save the instance associated with this operator for later processing */
				pToken->pUserData = (void *)pOp;
			}
		}
	}
	/* Tell the upper-layer to save the extracted token for later processing */
	return SXRET_OK;
}